

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void * google::protobuf::DynamicMessage::NewImpl(void *prototype,void *mem,Arena *arena)

{
  long lVar1;
  
  lVar1 = *(long *)((long)prototype + 0x10);
  memset(mem,0,(ulong)*(uint *)(lVar1 + 0x60));
  *(Arena **)((long)mem + 8) = arena;
  *(undefined ***)mem = &PTR__DynamicMessage_01973ce8;
  *(long *)((long)mem + 0x10) = lVar1;
  *(undefined4 *)((long)mem + 0x18) = 0;
  SharedCtor((DynamicMessage *)mem,true);
  return mem;
}

Assistant:

void* DynamicMessage::NewImpl(const void* prototype, void* mem, Arena* arena) {
  const auto* type_info =
      static_cast<const DynamicMessage*>(prototype)->type_info_;
  memset(mem, 0, type_info->class_data.allocation_size());
  return new (mem) DynamicMessage(type_info, arena);
}